

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.c++
# Opt level: O2

StringTree * capnp::operator*(StringTree *__return_storage_ptr__,Builder *param_2)

{
  Reader local_90;
  Reader local_48;
  
  DynamicStruct::Builder::asReader(&local_48,param_2);
  local_90.type = STRUCT;
  local_90.field_1.intValue = (int64_t)local_48.schema.super_Schema.raw;
  local_90.field_1.textValue.super_StringPtr.content.size_ = (size_t)local_48.reader.segment;
  local_90.field_1.listValue.reader.segment = (SegmentReader *)local_48.reader.capTable;
  local_90.field_1.listValue.reader.capTable = (CapTableReader *)local_48.reader.data;
  local_90.field_1.listValue.reader.ptr = (byte *)local_48.reader.pointers;
  local_90.field_1.listValue.reader.elementCount = local_48.reader.dataSize;
  local_90.field_1.structValue.reader.pointerCount = local_48.reader.pointerCount;
  local_90.field_1.listValue.reader.step._2_2_ = local_48.reader._38_2_;
  local_90.field_1._48_8_ = local_48.reader._40_8_;
  anon_unknown_2::stringify(__return_storage_ptr__,&local_90);
  DynamicValue::Reader::~Reader(&local_90);
  return __return_storage_ptr__;
}

Assistant:

kj::StringTree KJ_STRINGIFY(const DynamicStruct::Builder& value) { return stringify(value.asReader()); }